

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void newBinNE(IntView<0> x,IntView<0> y,BoolView *r)

{
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  bool bVar1;
  IntVar *pIVar2;
  void *pvVar3;
  _func_int **in_RCX;
  IntVar *in_RDX;
  undefined8 in_RSI;
  IntVar *in_RDI;
  Propagator *p;
  int v;
  int u;
  BoolView *in_stack_fffffffffffffe78;
  BoolView *in_stack_fffffffffffffe80;
  IntVar *in_stack_fffffffffffffea8;
  BinNE<0,_0,_1> *in_stack_fffffffffffffeb0;
  IntVar *in_stack_fffffffffffffeb8;
  IntVar *in_stack_fffffffffffffec0;
  undefined1 *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar4;
  BoolView local_128;
  IntView<4> local_118;
  IntVar *local_108;
  int iStack_100;
  int iStack_fc;
  undefined1 local_e9;
  IntView<4> local_d8;
  IntVar *local_c8;
  int iStack_c0;
  int iStack_bc;
  undefined1 local_a9;
  undefined1 local_a8 [24];
  Checker CStack_90;
  IntVar *local_88;
  int iStack_80;
  int iStack_7c;
  undefined1 local_75;
  undefined1 local_68 [16];
  IntVar *local_58;
  _func_int **pp_Stack_50;
  IntVar *local_48;
  int iStack_40;
  int iStack_3c;
  IntVar *local_38;
  int local_30;
  int local_2c;
  undefined1 local_20 [16];
  IntView<0> local_10;
  
  local_20._0_8_ = in_RDX;
  local_20._8_8_ = in_RCX;
  local_10.var = in_RDI;
  local_10._8_8_ = in_RSI;
  local_2c = IntView<0>::getType(&local_10);
  local_30 = IntView<0>::getType((IntView<0> *)local_20);
  local_38 = (IntVar *)0x0;
  if ((local_2c == 0) && (local_30 == 0)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffe80);
    if (bVar1) {
      in_stack_fffffffffffffeb8 = (IntVar *)operator_new(0x50);
      local_75 = 1;
      local_48 = local_10.var;
      iStack_40 = local_10.a;
      iStack_3c = local_10.b;
      local_58 = (IntVar *)local_20._0_8_;
      pp_Stack_50 = (_func_int **)local_20._8_8_;
      in_stack_fffffffffffffec8 = local_68;
      in_stack_fffffffffffffec0 = in_stack_fffffffffffffeb8;
      BoolView::BoolView(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      _x._8_7_ = in_stack_fffffffffffffed0;
      _x.var = (IntVar *)in_stack_fffffffffffffec8;
      _x.b._3_1_ = in_stack_fffffffffffffed7;
      _y._8_8_ = in_stack_fffffffffffffec0;
      _y.var = in_stack_fffffffffffffeb8;
      BinNE<0,_0,_0>::BinNE
                ((BinNE<0,_0,_0> *)in_stack_fffffffffffffeb0,_x,_y,
                 (BoolView *)in_stack_fffffffffffffea8);
      local_75 = 0;
      local_38 = in_stack_fffffffffffffeb8;
      BoolView::~BoolView((BoolView *)0x275b1e);
    }
    else {
      pIVar2 = (IntVar *)operator_new(0x50);
      local_a9 = 1;
      local_88 = local_10.var;
      iStack_80 = local_10.a;
      iStack_7c = local_10.b;
      local_a8._16_8_ = local_20._0_8_;
      CStack_90._vptr_Checker = (_func_int **)local_20._8_8_;
      in_stack_fffffffffffffeb0 = (BinNE<0,_0,_1> *)local_a8;
      in_stack_fffffffffffffea8 = pIVar2;
      BoolView::BoolView(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      _x_00._8_7_ = in_stack_fffffffffffffed0;
      _x_00.var = (IntVar *)in_stack_fffffffffffffec8;
      _x_00.b._3_1_ = in_stack_fffffffffffffed7;
      _y_00._8_8_ = in_stack_fffffffffffffec0;
      _y_00.var = in_stack_fffffffffffffeb8;
      BinNE<0,_0,_1>::BinNE
                (in_stack_fffffffffffffeb0,_x_00,_y_00,(BoolView *)in_stack_fffffffffffffea8);
      local_a9 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x275c08);
    }
  }
  if ((local_2c == 0) && (local_30 == 4)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffe80);
    if (bVar1) {
      pvVar3 = operator_new(0x50);
      local_e9 = 1;
      local_c8 = local_10.var;
      iStack_c0 = local_10.a;
      iStack_bc = local_10.b;
      IntView<4>::IntView<0>(&local_d8,(IntView<0> *)local_20);
      BoolView::BoolView(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      _x_01._8_7_ = in_stack_fffffffffffffed0;
      _x_01.var = (IntVar *)in_stack_fffffffffffffec8;
      _x_01.b._3_1_ = in_stack_fffffffffffffed7;
      _y_01._8_8_ = in_stack_fffffffffffffec0;
      _y_01.var = in_stack_fffffffffffffeb8;
      BinNE<0,_4,_0>::BinNE
                ((BinNE<0,_4,_0> *)in_stack_fffffffffffffeb0,_x_01,_y_01,
                 (BoolView *)in_stack_fffffffffffffea8);
      local_e9 = 0;
      local_38 = (IntVar *)pvVar3;
      BoolView::~BoolView((BoolView *)0x275d25);
    }
    else {
      pvVar3 = operator_new(0x50);
      uVar4 = 1;
      local_108 = local_10.var;
      iStack_100 = local_10.a;
      iStack_fc = local_10.b;
      IntView<4>::IntView<0>(&local_118,(IntView<0> *)local_20);
      BoolView::BoolView(&local_128,in_stack_fffffffffffffe78);
      _x_02._8_7_ = in_stack_fffffffffffffed0;
      _x_02.var = (IntVar *)in_stack_fffffffffffffec8;
      _x_02.b._3_1_ = uVar4;
      _y_02._8_8_ = in_stack_fffffffffffffec0;
      _y_02.var = in_stack_fffffffffffffeb8;
      BinNE<0,_4,_1>::BinNE
                ((BinNE<0,_4,_1> *)in_stack_fffffffffffffeb0,_x_02,_y_02,
                 (BoolView *)in_stack_fffffffffffffea8);
      local_38 = (IntVar *)pvVar3;
      BoolView::~BoolView((BoolView *)0x275e12);
    }
  }
  return;
}

Assistant:

void newBinNE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinNE, 0, 0);
	BinProp(BinNE, 0, 4);

	assert(p);
}